

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altref_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2863ff::AltRefFramePresenceTestLarge_AltRefFrameEncodePresenceTest_Test::TestBody
          (AltRefFramePresenceTestLarge_AltRefFrameEncodePresenceTest_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  char *message;
  string *in_RDI;
  AssertionResult gtest_ar;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  I420VideoSource video;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffed4;
  int *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  int line;
  uint in_stack_fffffffffffffef0;
  uint uVar4;
  undefined1 in_stack_fffffffffffffef4;
  undefined1 in_stack_fffffffffffffef5;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  Type TVar5;
  HasNewFatalFailureHelper *this_00;
  uint in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff18;
  AssertionResult local_e0 [2];
  uint local_bc;
  TestPartResultReporterInterface in_stack_ffffffffffffff48;
  AssertHelper *in_stack_ffffffffffffff50;
  undefined1 local_89 [33];
  undefined1 local_68 [104];
  
  this_00 = (HasNewFatalFailureHelper *)local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_89 + 1),"hantro_collage_w352h288.yuv",(allocator *)this_00);
  uVar3 = 100;
  libaom_test::I420VideoSource::I420VideoSource
            ((I420VideoSource *)this_00,in_RDI,
             CONCAT13(in_stack_fffffffffffffef7,
                      CONCAT12(in_stack_fffffffffffffef6,
                               CONCAT11(in_stack_fffffffffffffef5,in_stack_fffffffffffffef4))),
             in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
             in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
  std::__cxx11::string::~string((string *)(local_89 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_89);
  uVar1 = testing::internal::AlwaysTrue();
  if ((bool)uVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(this_00);
    in_stack_fffffffffffffef6 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffef6) {
      (**(code **)(*(long *)((long)&in_RDI->field_2 + 8) + 0x10))
                ((undefined1 *)((long)&in_RDI->field_2 + 8),local_68);
    }
    in_stack_fffffffffffffef5 =
         testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure
                   ((HasNewFatalFailureHelper *)&stack0xffffffffffffff48);
    if ((bool)in_stack_fffffffffffffef5) {
      local_bc = 2;
    }
    else {
      local_bc = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)CONCAT44(in_stack_fffffffffffffed4,uVar3));
    TVar5 = (Type)((ulong)in_RDI >> 0x20);
    if (local_bc == 0) {
      uVar4 = local_bc;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                 (int *)CONCAT44(in_stack_fffffffffffffed4,uVar3));
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_e0);
      line = CONCAT13(bVar2,(int3)in_stack_fffffffffffffeec);
      if (!bVar2) {
        testing::Message::Message((Message *)this_00);
        message = testing::AssertionResult::failure_message((AssertionResult *)0x4b4804);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)this_00,TVar5,
                   (char *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffef6,
                                                   CONCAT15(in_stack_fffffffffffffef5,
                                                            CONCAT14(in_stack_fffffffffffffef4,uVar4
                                                                    )))),line,message);
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffff50,
                   (Message *)in_stack_ffffffffffffff48._vptr_TestPartResultReporterInterface);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffed4,uVar3));
        testing::Message::~Message((Message *)0x4b4852);
      }
      local_bc = (uint)!bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x4b48ae);
      if (local_bc == 0) {
        local_bc = 0;
      }
      goto LAB_004b48c0;
    }
    in_stack_fffffffffffffef0 = local_bc;
    if (local_bc != 2) goto LAB_004b48c0;
  }
  TVar5 = (Type)((ulong)in_RDI >> 0x20);
  testing::Message::Message((Message *)this_00);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)this_00,TVar5,
             (char *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffef6,
                                             CONCAT15(in_stack_fffffffffffffef5,
                                                      CONCAT14(in_stack_fffffffffffffef4,
                                                               in_stack_fffffffffffffef0)))),
             in_stack_fffffffffffffeec,in_stack_fffffffffffffee0);
  testing::internal::AssertHelper::operator=
            (in_stack_ffffffffffffff50,
             (Message *)in_stack_ffffffffffffff48._vptr_TestPartResultReporterInterface);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffed4,uVar3));
  testing::Message::~Message((Message *)0x4b4733);
  local_bc = 1;
LAB_004b48c0:
  libaom_test::I420VideoSource::~I420VideoSource((I420VideoSource *)0x4b48cd);
  return;
}

Assistant:

TEST_P(AltRefFramePresenceTestLarge, AltRefFrameEncodePresenceTest) {
  libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                     cfg_.g_timebase.den, cfg_.g_timebase.num,
                                     0, 100);
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  ASSERT_EQ(is_arf_frame_present_, 1);
}